

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O0

void __thiscall QNetworkProxy::setHeaders(QNetworkProxy *this,QHttpHeaders *newHeaders)

{
  QNetworkProxyPrivate *pQVar1;
  QNetworkHeadersPrivate *in_RSI;
  QHttpHeaders *in_RDI;
  
  pQVar1 = QSharedDataPointer<QNetworkProxyPrivate>::operator->
                     ((QSharedDataPointer<QNetworkProxyPrivate> *)in_RSI);
  if ((pQVar1->type != HttpProxy) &&
     (pQVar1 = QSharedDataPointer<QNetworkProxyPrivate>::operator->
                         ((QSharedDataPointer<QNetworkProxyPrivate> *)in_RSI),
     pQVar1->type != HttpCachingProxy)) {
    return;
  }
  QSharedDataPointer<QNetworkProxyPrivate>::operator->
            ((QSharedDataPointer<QNetworkProxyPrivate> *)in_RSI);
  QNetworkHeadersPrivate::setHeaders(in_RSI,in_RDI);
  return;
}

Assistant:

void QNetworkProxy::setHeaders(QHttpHeaders &&newHeaders)
{
    if (d->type == HttpProxy || d->type == HttpCachingProxy)
        d->headers.setHeaders(std::move(newHeaders));
}